

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          GLenum shaderType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  ostream *poVar4;
  int iVar5;
  ostringstream source;
  
  poVar4 = (ostream *)&source;
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)&source,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  pcVar2 = SSBOArrayLengthTests::init::arraysSized + 1;
  iVar5 = (int)ctx;
  if (!bVar1) {
    if (iVar5 - 0x8e87U < 2) {
      pcVar2 = "#extension GL_EXT_tessellation_shader : require\n";
    }
    else if (iVar5 == 0x8dd9) {
      pcVar2 = "#extension GL_EXT_geometry_shader : require\n";
    }
  }
  std::operator<<(poVar3,pcVar2);
  if (iVar5 == 0x8e87) {
    pcVar2 = "layout(triangles, equal_spacing, cw) in;\n";
  }
  else {
    if (iVar5 != 0x8e88) goto LAB_005b7b31;
    pcVar2 = "layout(vertices = 3) out;\n";
  }
  poVar4 = std::operator<<((ostream *)&source,pcVar2);
LAB_005b7b31:
  std::operator<<(poVar4,"void main() {}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return __return_storage_ptr__;
}

Assistant:

std::string genCommonSource (NegativeTestContext& ctx, glw::GLenum shaderType)
{
	const bool				isES32		= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version		= isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	std::ostringstream		source;

	source << glu::getGLSLVersionDeclaration(version) << "\n"
		   << ((isES32) ? "" : getShaderExtensionDeclaration(shaderType));

	switch (shaderType)
	{
		case GL_TESS_CONTROL_SHADER:
			source	<< "layout(vertices = 3) out;\n"
					<< "void main() {}\n";
			break;

		case GL_TESS_EVALUATION_SHADER:
			source	<< "layout(triangles, equal_spacing, cw) in;\n"
					<< "void main() {}\n";
			break;

		default:
			source  << "void main() {}\n";
			break;
	}

	return source.str();
}